

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_rotatev3_xy_quarter_turn(void)

{
  int iVar1;
  vector3 *pvVar2;
  undefined1 local_5c [8];
  vector3 r;
  matrix4 m;
  
  matrix4_identity((matrix4 *)((long)&r.field_0 + 4));
  pvVar2 = vector3_get_reference_vector3(2);
  matrix4_rotatev3((matrix4 *)((long)&r.field_0 + 4),pvVar2,1.5707964);
  pvVar2 = vector3_get_reference_vector3(1);
  vector3_set((vector3 *)local_5c,pvVar2);
  vector3_multiplym4((vector3 *)local_5c,(matrix4 *)((long)&r.field_0 + 4));
  pvVar2 = vector3_get_reference_vector3(3);
  iVar1 = vector3_equals((vector3 *)local_5c,pvVar2);
  if (iVar1 == 0) {
    m.field_0._56_8_ = anon_var_dwarf_7ec;
  }
  else {
    m.field_0._56_8_ = 0;
  }
  return (char *)m.field_0._56_8_;
}

Assistant:

static char *test_matrix4_rotatev3_xy_quarter_turn(void)
{
	struct matrix4 m;
	struct vector3 r;

	matrix4_identity(&m);
	matrix4_rotatev3(&m, HYP_VECTOR3_UNIT_Y, HYP_TAU / 4.0f);
	vector3_set(&r, HYP_VECTOR3_UNIT_X);
	vector3_multiplym4(&r, &m);
	test_assert(vector3_equals(&r, HYP_VECTOR3_UNIT_Z));

	return NULL;
}